

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImBezierClosestPointCasteljau
                 (ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImVec2 *p,float tess_tol)

{
  float in_XMM0_Da;
  float p_closest_dist2;
  ImVec2 p_last;
  float in_stack_00000020;
  ImVec2 p_closest;
  float in_stack_00000060;
  ImVec2 local_8;
  
  if (0.0 < in_XMM0_Da) {
    ImVec2::ImVec2(&local_8);
    BezierClosestPointCasteljauStep
              ((ImVec2 *)p_closest,p1,p2,&p3->x,p4._4_4_,p4._0_4_,p._4_4_,p._0_4_,tess_tol,
               in_stack_00000020,p_last.y,p_last.x,in_stack_00000060,(int)p_closest_dist2);
    return local_8;
  }
  __assert_fail("tess_tol > 0.0f",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                ,0x4ea,
                "ImVec2 ImBezierClosestPointCasteljau(const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, float)"
               );
}

Assistant:

ImVec2 ImBezierClosestPointCasteljau(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& p, float tess_tol)
{
    IM_ASSERT(tess_tol > 0.0f);
    ImVec2 p_last = p1;
    ImVec2 p_closest;
    float p_closest_dist2 = FLT_MAX;
    BezierClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, tess_tol, 0);
    return p_closest;
}